

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

json_t * do_deep_copy(json_t *json,hashtable_t *parents)

{
  hashtable_t *parents_local;
  json_t *json_local;
  
  if (json == (json_t *)0x0) {
    json_local = (json_t *)0x0;
  }
  else {
    switch(json->type) {
    case JSON_OBJECT:
      json_local = json_object_deep_copy(json,parents);
      break;
    case JSON_ARRAY:
      json_local = json_array_deep_copy(json,parents);
      break;
    case JSON_STRING:
      json_local = json_string_copy(json);
      break;
    case JSON_INTEGER:
      json_local = json_integer_copy(json);
      break;
    case JSON_REAL:
      json_local = json_real_copy(json);
      break;
    case JSON_TRUE:
    case JSON_FALSE:
    case JSON_NULL:
      json_local = json;
      break;
    default:
      json_local = (json_t *)0x0;
    }
  }
  return json_local;
}

Assistant:

json_t *do_deep_copy(const json_t *json, hashtable_t *parents) {
    if (!json)
        return NULL;

    switch (json_typeof(json)) {
        case JSON_OBJECT:
            return json_object_deep_copy(json, parents);
        case JSON_ARRAY:
            return json_array_deep_copy(json, parents);
            /* for the rest of the types, deep copying doesn't differ from
               shallow copying */
        case JSON_STRING:
            return json_string_copy(json);
        case JSON_INTEGER:
            return json_integer_copy(json);
        case JSON_REAL:
            return json_real_copy(json);
        case JSON_TRUE:
        case JSON_FALSE:
        case JSON_NULL:
            return (json_t *) json;
        default:
            return NULL;
    }
}